

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void __thiscall ImFont::BuildLookupTable(ImFont *this)

{
  ushort uVar1;
  int iVar2;
  float *pfVar3;
  unsigned_short *puVar4;
  float fVar5;
  float fVar6;
  ImWchar IVar7;
  undefined2 uVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  int iVar12;
  float *pfVar13;
  Glyph *pGVar14;
  Glyph *pGVar15;
  char *__function;
  long lVar16;
  ulong uVar17;
  uint uVar18;
  ulong uVar19;
  uint uVar20;
  uint uVar21;
  float fVar22;
  
  uVar20 = (this->Glyphs).Size;
  if ((ulong)uVar20 == 0) {
    uVar21 = 1;
  }
  else {
    uVar21 = 0;
    uVar18 = 0;
    if (0 < (int)uVar20) {
      uVar18 = uVar20;
    }
    if (uVar18 <= uVar20 - 1) {
      __function = "value_type &ImVector<ImFont::Glyph>::operator[](int) [T = ImFont::Glyph]";
      goto LAB_00145828;
    }
    lVar16 = 0;
    do {
      uVar1 = *(ushort *)((long)&((this->Glyphs).Data)->Codepoint + lVar16);
      uVar18 = (uint)uVar1;
      if (uVar1 < uVar21) {
        uVar18 = uVar21;
      }
      uVar21 = uVar18;
      lVar16 = lVar16 + 0x28;
    } while ((ulong)uVar20 * 0x28 != lVar16);
    if (0xfffe < (int)uVar20) {
      __assert_fail("Glyphs.Size < 0xFFFF",
                    "/workspace/llm4binary/github/license_c_cmakelists/gwerners[P]BasicGLFWImgui/imgui_draw.cpp"
                    ,0x6af,"void ImFont::BuildLookupTable()");
    }
    uVar21 = uVar21 + 1;
  }
  pfVar3 = (this->IndexXAdvance).Data;
  if (pfVar3 != (float *)0x0) {
    (this->IndexXAdvance).Size = 0;
    (this->IndexXAdvance).Capacity = 0;
    ImGui::MemFree(pfVar3);
    (this->IndexXAdvance).Data = (float *)0x0;
  }
  puVar4 = (this->IndexLookup).Data;
  if (puVar4 != (unsigned_short *)0x0) {
    (this->IndexLookup).Size = 0;
    (this->IndexLookup).Capacity = 0;
    ImGui::MemFree(puVar4);
    (this->IndexLookup).Data = (unsigned_short *)0x0;
  }
  GrowIndex(this,uVar21);
  uVar20 = (this->Glyphs).Size;
  uVar19 = (ulong)uVar20;
  if (0 < (int)uVar20) {
    iVar12 = (this->IndexXAdvance).Size;
    pfVar3 = (this->IndexXAdvance).Data;
    iVar2 = (this->IndexLookup).Size;
    puVar4 = (this->IndexLookup).Data;
    pfVar13 = &((this->Glyphs).Data)->XAdvance;
    uVar17 = 0;
    do {
      if (iVar12 <= (int)(uint)((Glyph *)(pfVar13 + -1))->Codepoint) goto LAB_001457fc;
      uVar18 = (uint)((Glyph *)(pfVar13 + -1))->Codepoint;
      pfVar3[uVar18] = *pfVar13;
      if (iVar2 <= (int)uVar18) goto LAB_00145813;
      puVar4[uVar18] = (unsigned_short)uVar17;
      uVar17 = uVar17 + 1;
      pfVar13 = pfVar13 + 10;
    } while (uVar19 != uVar17);
  }
  iVar12 = (this->IndexLookup).Size;
  if ((iVar12 < 0x21) || (uVar1 = (this->IndexLookup).Data[0x20], uVar1 == 0xffff)) {
    pGVar14 = this->FallbackGlyph;
  }
  else {
    pGVar14 = (Glyph *)((long)&((this->Glyphs).Data)->Codepoint + (ulong)((uint)uVar1 * 0x28));
  }
  if (pGVar14 == (Glyph *)0x0) {
LAB_00145782:
    if (((int)(uint)this->FallbackChar < iVar12) &&
       (uVar19 = (ulong)(this->IndexLookup).Data[this->FallbackChar], uVar19 != 0xffff)) {
      pGVar15 = (this->Glyphs).Data;
      pGVar14 = pGVar15 + uVar19;
      this->FallbackGlyph = pGVar14;
      if (pGVar15 == (Glyph *)0x0) goto LAB_001457be;
      fVar22 = pGVar14->XAdvance;
    }
    else {
      this->FallbackGlyph = (Glyph *)0x0;
LAB_001457be:
      fVar22 = 0.0;
    }
    this->FallbackXAdvance = fVar22;
    uVar20 = (this->IndexXAdvance).Size;
    pfVar3 = (this->IndexXAdvance).Data;
    uVar17 = 0;
    uVar19 = (ulong)uVar20;
    if ((int)uVar20 < 1) {
      uVar19 = uVar17;
    }
    while (uVar19 != uVar17) {
      pfVar13 = pfVar3 + uVar17;
      if (*pfVar13 <= 0.0 && *pfVar13 != 0.0) {
        pfVar3[uVar17] = fVar22;
      }
      uVar17 = uVar17 + 1;
      if (uVar21 == uVar17) {
        return;
      }
    }
  }
  else {
    if ((int)uVar20 < 1) {
      __assert_fail("Size > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/gwerners[P]BasicGLFWImgui/imgui.h"
                    ,0x365,"value_type &ImVector<ImFont::Glyph>::back() [T = ImFont::Glyph]");
    }
    pGVar14 = (this->Glyphs).Data;
    if (pGVar14[uVar19 - 1].Codepoint != 9) {
      uVar19 = uVar19 + 1;
      iVar2 = (this->Glyphs).Capacity;
      if (iVar2 <= (int)uVar20) {
        if (iVar2 == 0) {
          uVar20 = 8;
        }
        else {
          uVar20 = iVar2 / 2 + iVar2;
        }
        uVar17 = (ulong)uVar20;
        if ((int)uVar20 <= (int)uVar19) {
          uVar17 = uVar19 & 0xffffffff;
        }
        pGVar14 = (Glyph *)ImGui::MemAlloc(uVar17 * 0x28);
        pGVar15 = (this->Glyphs).Data;
        if (pGVar15 == (Glyph *)0x0) {
          pGVar15 = (Glyph *)0x0;
        }
        else {
          memcpy(pGVar14,pGVar15,(long)(this->Glyphs).Size * 0x28);
          pGVar15 = (this->Glyphs).Data;
        }
        ImGui::MemFree(pGVar15);
        (this->Glyphs).Data = pGVar14;
        (this->Glyphs).Capacity = (int)uVar17;
        iVar12 = (this->IndexLookup).Size;
      }
      (this->Glyphs).Size = (int)uVar19;
    }
    if ((iVar12 < 0x21) || (uVar17 = (ulong)(this->IndexLookup).Data[0x20], uVar17 == 0xffff)) {
      pGVar15 = this->FallbackGlyph;
    }
    else {
      pGVar15 = pGVar14 + uVar17;
    }
    fVar22 = pGVar15->V1;
    pGVar14[uVar19 - 1].U1 = pGVar15->U1;
    pGVar14[uVar19 - 1].V1 = fVar22;
    IVar7 = pGVar15->Codepoint;
    uVar8 = *(undefined2 *)&pGVar15->field_0x2;
    fVar9 = pGVar15->XAdvance;
    fVar10 = pGVar15->X0;
    fVar11 = pGVar15->Y0;
    fVar22 = pGVar15->Y1;
    fVar5 = pGVar15->U0;
    fVar6 = pGVar15->V0;
    pGVar14[uVar19 - 1].X1 = pGVar15->X1;
    pGVar14[uVar19 - 1].Y1 = fVar22;
    pGVar14[uVar19 - 1].U0 = fVar5;
    pGVar14[uVar19 - 1].V0 = fVar6;
    pGVar15 = pGVar14 + (uVar19 - 1);
    pGVar15->Codepoint = IVar7;
    *(undefined2 *)&pGVar15->field_0x2 = uVar8;
    pGVar15->XAdvance = fVar9;
    pGVar14[uVar19 - 1].X0 = fVar10;
    pGVar14[uVar19 - 1].Y0 = fVar11;
    pGVar14[uVar19 - 1].Codepoint = 9;
    fVar22 = pGVar14[uVar19 - 1].XAdvance * 4.0;
    pGVar14[uVar19 - 1].XAdvance = fVar22;
    if (9 < (this->IndexXAdvance).Size) {
      (this->IndexXAdvance).Data[9] = fVar22;
      iVar12 = (this->IndexLookup).Size;
      if (iVar12 < 10) {
LAB_00145813:
        __function = "value_type &ImVector<unsigned short>::operator[](int) [T = unsigned short]";
        goto LAB_00145828;
      }
      (this->IndexLookup).Data[9] = (short)(this->Glyphs).Size - 1;
      goto LAB_00145782;
    }
  }
LAB_001457fc:
  __function = "value_type &ImVector<float>::operator[](int) [T = float]";
LAB_00145828:
  __assert_fail("i < Size",
                "/workspace/llm4binary/github/license_c_cmakelists/gwerners[P]BasicGLFWImgui/imgui.h"
                ,0x35b,__function);
}

Assistant:

void ImFont::BuildLookupTable()
{
    int max_codepoint = 0;
    for (int i = 0; i != Glyphs.Size; i++)
        max_codepoint = ImMax(max_codepoint, (int)Glyphs[i].Codepoint);

    IM_ASSERT(Glyphs.Size < 0xFFFF); // -1 is reserved
    IndexXAdvance.clear();
    IndexLookup.clear();
    GrowIndex(max_codepoint + 1);
    for (int i = 0; i < Glyphs.Size; i++)
    {
        int codepoint = (int)Glyphs[i].Codepoint;
        IndexXAdvance[codepoint] = Glyphs[i].XAdvance;
        IndexLookup[codepoint] = (unsigned short)i;
    }

    // Create a glyph to handle TAB
    // FIXME: Needs proper TAB handling but it needs to be contextualized (or we could arbitrary say that each string starts at "column 0" ?)
    if (FindGlyph((unsigned short)' '))
    {
        if (Glyphs.back().Codepoint != '\t')   // So we can call this function multiple times
            Glyphs.resize(Glyphs.Size + 1);
        ImFont::Glyph& tab_glyph = Glyphs.back();
        tab_glyph = *FindGlyph((unsigned short)' ');
        tab_glyph.Codepoint = '\t';
        tab_glyph.XAdvance *= 4;
        IndexXAdvance[(int)tab_glyph.Codepoint] = (float)tab_glyph.XAdvance;
        IndexLookup[(int)tab_glyph.Codepoint] = (unsigned short)(Glyphs.Size-1);
    }

    FallbackGlyph = NULL;
    FallbackGlyph = FindGlyph(FallbackChar);
    FallbackXAdvance = FallbackGlyph ? FallbackGlyph->XAdvance : 0.0f;
    for (int i = 0; i < max_codepoint + 1; i++)
        if (IndexXAdvance[i] < 0.0f)
            IndexXAdvance[i] = FallbackXAdvance;
}